

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::traverse(xml_node *this,xml_tree_walker *walker)

{
  byte bVar1;
  ulong uVar2;
  long *in_RSI;
  long *in_RDI;
  bool bVar3;
  xml_node arg_end;
  xml_node arg_for_each;
  xml_node_struct *cur;
  xml_node arg_begin;
  xml_node_struct *local_48;
  xml_node local_38;
  xml_node local_30;
  xml_node_struct *local_28;
  xml_node local_20;
  long *local_18;
  bool local_1;
  
  *(undefined4 *)(in_RSI + 1) = 0xffffffff;
  local_18 = in_RSI;
  xml_node(&local_20,(xml_node_struct *)*in_RDI);
  uVar2 = (**(code **)(*local_18 + 0x10))(local_18,&local_20);
  if ((uVar2 & 1) == 0) {
    local_1 = false;
  }
  else {
    if (*in_RDI == 0) {
      local_48 = (xml_node_struct *)0x0;
    }
    else {
      local_48 = *(xml_node_struct **)(*in_RDI + 0x20);
    }
    local_28 = local_48;
    if (local_48 != (xml_node_struct *)0x0) {
      *(int *)(local_18 + 1) = (int)local_18[1] + 1;
      do {
        xml_node(&local_30,local_28);
        uVar2 = (**(code **)(*local_18 + 0x18))(local_18,&local_30);
        if ((uVar2 & 1) == 0) {
          return false;
        }
        if (local_28->first_child == (xml_node_struct *)0x0) {
          if (local_28->next_sibling == (xml_node_struct *)0x0) {
            while( true ) {
              bVar3 = false;
              if ((local_28->next_sibling == (xml_node_struct *)0x0) &&
                 (bVar3 = false, local_28 != (xml_node_struct *)*in_RDI)) {
                bVar3 = local_28->parent != (xml_node_struct *)0x0;
              }
              if (!bVar3) break;
              *(int *)(local_18 + 1) = (int)local_18[1] + -1;
              local_28 = local_28->parent;
            }
            if (local_28 != (xml_node_struct *)*in_RDI) {
              local_28 = local_28->next_sibling;
            }
          }
          else {
            local_28 = local_28->next_sibling;
          }
        }
        else {
          *(int *)(local_18 + 1) = (int)local_18[1] + 1;
          local_28 = local_28->first_child;
        }
        bVar3 = false;
        if (local_28 != (xml_node_struct *)0x0) {
          bVar3 = local_28 != (xml_node_struct *)*in_RDI;
        }
      } while (bVar3);
    }
    xml_node(&local_38,(xml_node_struct *)*in_RDI);
    bVar1 = (**(code **)(*local_18 + 0x20))(local_18,&local_38);
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

PUGI__FN bool xml_node::traverse(xml_tree_walker& walker)
	{
		walker._depth = -1;

		xml_node arg_begin(_root);
		if (!walker.begin(arg_begin)) return false;

		xml_node_struct* cur = _root ? _root->first_child + 0 : 0;

		if (cur)
		{
			++walker._depth;

			do
			{
				xml_node arg_for_each(cur);
				if (!walker.for_each(arg_for_each))
					return false;

				if (cur->first_child)
				{
					++walker._depth;
					cur = cur->first_child;
				}
				else if (cur->next_sibling)
					cur = cur->next_sibling;
				else
				{
					while (!cur->next_sibling && cur != _root && cur->parent)
					{
						--walker._depth;
						cur = cur->parent;
					}

					if (cur != _root)
						cur = cur->next_sibling;
				}
			}
			while (cur && cur != _root);
		}

		assert(walker._depth == -1);

		xml_node arg_end(_root);
		return walker.end(arg_end);
	}